

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

void google::CaptureTestOutput(int fd,string *filename)

{
  ostream *poVar1;
  CapturedStream *this;
  LogMessage local_58;
  LogMessageVoidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  LogMessageVoidify local_19;
  string *local_18;
  string *filename_local;
  int fd_local;
  
  local_31 = 0;
  local_18 = filename;
  filename_local._4_4_ = fd;
  if (fd != 1 && fd != 2) {
    LogMessageVoidify::LogMessageVoidify(&local_19);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
               ,0x148);
    local_31 = 1;
    poVar1 = LogMessage::stream(&local_30);
    poVar1 = std::operator<<(poVar1,"Check failed: (fd == STDOUT_FILENO) || (fd == STDERR_FILENO) ")
    ;
    LogMessageVoidify::operator&(&local_19,poVar1);
  }
  if ((local_31 & 1) != 0) {
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
  }
  if (*(long *)(s_captured_streams + (long)filename_local._4_4_ * 8) == 0) {
    this = (CapturedStream *)operator_new(0x28);
    CapturedStream::CapturedStream(this,filename_local._4_4_,local_18);
    *(CapturedStream **)(s_captured_streams + (long)filename_local._4_4_ * 8) = this;
    return;
  }
  LogMessageVoidify::LogMessageVoidify(local_45);
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
             ,0x149);
  poVar1 = LogMessage::stream(&local_58);
  poVar1 = std::operator<<(poVar1,"Check failed: s_captured_streams[fd] == NULL ");
  LogMessageVoidify::operator&(local_45,poVar1);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_58);
}

Assistant:

static inline void CaptureTestOutput(int fd, const string & filename) {
  CHECK((fd == STDOUT_FILENO) || (fd == STDERR_FILENO));
  CHECK(s_captured_streams[fd] == NULL);
  s_captured_streams[fd] = new CapturedStream(fd, filename);
}